

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void __thiscall Diligent::FixedBlockMemoryAllocator::CreateNewPage(FixedBlockMemoryAllocator *this)

{
  Char *Message;
  size_type sVar1;
  char (*in_RCX) [16];
  value_type local_48 [3];
  undefined1 local_30 [8];
  string msg;
  FixedBlockMemoryAllocator *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_BlockSize == 0) {
    FormatString<char[26],char[16]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_BlockSize > 0",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CreateNewPage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0xcc);
    std::__cxx11::string::~string((string *)local_30);
  }
  std::
  vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::IMemoryAllocator>>
  ::emplace_back<Diligent::FixedBlockMemoryAllocator&>
            ((vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::IMemoryAllocator>>
              *)&this->m_PagePool,this);
  sVar1 = std::
          vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
          ::size(&this->m_PagePool);
  local_48[0] = sVar1 - 1;
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>_>
  ::insert(&this->m_AvailablePages,local_48);
  sVar1 = std::
          vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
          ::size(&this->m_PagePool);
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>_>
  ::reserve(&this->m_AddrToPageId,sVar1 * this->m_NumBlocksInPage);
  return;
}

Assistant:

void FixedBlockMemoryAllocator::CreateNewPage()
{
    VERIFY_EXPR(m_BlockSize > 0);
    m_PagePool.emplace_back(*this);
    m_AvailablePages.insert(m_PagePool.size() - 1);
    m_AddrToPageId.reserve(m_PagePool.size() * m_NumBlocksInPage);
}